

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

string * CoreML::Specification::ArrayFeatureType_ArrayDataType_Name_abi_cxx11_
                   (ArrayFeatureType_ArrayDataType value)

{
  int iVar1;
  string *local_30;
  int idx;
  ArrayFeatureType_ArrayDataType value_local;
  
  if (ArrayFeatureType_ArrayDataType_Name[abi:cxx11](CoreML::Specification::ArrayFeatureType_ArrayDataType)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&ArrayFeatureType_ArrayDataType_Name[abi:cxx11](CoreML::Specification::ArrayFeatureType_ArrayDataType)
                                 ::dummy);
    if (iVar1 != 0) {
      ArrayFeatureType_ArrayDataType_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)ArrayFeatureType_ArrayDataType_entries,
                      (int *)ArrayFeatureType_ArrayDataType_entries_by_number,5,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)ArrayFeatureType_ArrayDataType_strings_abi_cxx11_);
      __cxa_guard_release(&ArrayFeatureType_ArrayDataType_Name[abi:cxx11](CoreML::Specification::ArrayFeatureType_ArrayDataType)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)ArrayFeatureType_ArrayDataType_entries,
                     (int *)ArrayFeatureType_ArrayDataType_entries_by_number,5,value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(ArrayFeatureType_ArrayDataType_strings_abi_cxx11_ + (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const std::string& ArrayFeatureType_ArrayDataType_Name(
    ArrayFeatureType_ArrayDataType value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          ArrayFeatureType_ArrayDataType_entries,
          ArrayFeatureType_ArrayDataType_entries_by_number,
          5, ArrayFeatureType_ArrayDataType_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      ArrayFeatureType_ArrayDataType_entries,
      ArrayFeatureType_ArrayDataType_entries_by_number,
      5, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     ArrayFeatureType_ArrayDataType_strings[idx].get();
}